

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  char *this;
  undefined8 *in_RSI;
  int in_EDI;
  rep_conflict rVar3;
  double dVar4;
  rep_conflict rVar5;
  int i_2;
  __enable_if_is_duration<std::chrono::duration<double>_> totalTime;
  long hitCount_1;
  long totalCount_1;
  long hitCount;
  long totalCount;
  long prevHitCount;
  long prevTotalCount;
  int i_1;
  seconds oneSecond;
  time_point startTime;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  string s;
  int i;
  int durationLimit;
  int demandSize;
  int cacheSize;
  int numThreads;
  memory_order __b_3;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  pointer in_stack_fffffffffffffd88;
  vector<std::thread,_std::allocator<std::thread>_> *in_stack_fffffffffffffd90;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffd98;
  size_t in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  uint uVar6;
  undefined4 in_stack_fffffffffffffdb0;
  uint uVar7;
  undefined4 in_stack_fffffffffffffdb4;
  uint uVar8;
  _func_void *in_stack_fffffffffffffdb8;
  ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>
  *in_stack_fffffffffffffdc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  size_t in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  ThreadSafeScalableCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>
  *in_stack_fffffffffffffde0;
  atomic<long> *paVar9;
  int local_1ac;
  duration<double,_std::ratio<1L,_1L>_> local_198;
  __int_type_conflict local_190;
  __int_type_conflict local_188;
  rep local_180;
  __atomic_base<long> local_178;
  __atomic_base<long> local_170;
  __int_type_conflict local_168;
  long local_160;
  int local_14c;
  undefined8 local_148;
  undefined8 local_140;
  vector<std::thread,_std::allocator<std::thread>_> local_138;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [32];
  string local_c8 [36];
  int local_a4;
  int local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  undefined8 *local_70;
  int local_68;
  int local_64;
  __int_type_conflict local_60;
  memory_order local_58;
  int local_54;
  atomic<long> *local_50;
  __int_type_conflict local_48;
  memory_order local_40;
  int local_3c;
  atomic<long> *local_38;
  __atomic_base<long> local_30;
  memory_order local_28;
  undefined4 local_24;
  atomic<long> *local_20;
  __atomic_base<long> local_18;
  memory_order local_10;
  undefined4 local_c;
  atomic<long> *local_8;
  
  local_64 = 0;
  local_70 = in_RSI;
  if (in_EDI < 5) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar2 = std::operator<<(poVar2,(char *)*local_70);
    std::operator<<(poVar2," <lru|scalable> <threads> <cache-size> <demand-size> [<duration>]\n");
    local_64 = 1;
  }
  else {
    local_68 = in_EDI;
    iVar1 = strcmp((char *)in_RSI[1],"lru");
    if (iVar1 == 0) {
      cacheType = LRU;
    }
    else {
      iVar1 = strcmp((char *)local_70[1],"scalable");
      if (iVar1 != 0) {
        std::operator<<((ostream *)&std::cerr,"Cache type must be either \"lru\" or \"scalable\"\n")
        ;
        return 1;
      }
      cacheType = PTHREAD_MUTEX_RECURSIVE;
    }
    local_74 = boost::lexical_cast<int,char*>((char **)in_stack_fffffffffffffd90);
    local_78 = boost::lexical_cast<int,char*>((char **)in_stack_fffffffffffffd90);
    local_7c = boost::lexical_cast<int,char*>((char **)in_stack_fffffffffffffd90);
    local_80 = 0;
    if (5 < local_68) {
      local_80 = boost::lexical_cast<int,char*>((char **)in_stack_fffffffffffffd90);
    }
    operator_new(0x2b8);
    tstarling::
    ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>
    ::ThreadSafeLRUCache(in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8);
    std::
    unique_ptr<tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,int,tstarling::ThreadSafeStringKey::HashCompare>,std::default_delete<tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,int,tstarling::ThreadSafeStringKey::HashCompare>>>
    ::
    unique_ptr<std::default_delete<tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,int,tstarling::ThreadSafeStringKey::HashCompare>>,void>
              ((unique_ptr<tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>,_std::default_delete<tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>_>_>
                *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    std::
    unique_ptr<tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>,_std::default_delete<tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>_>_>
    ::operator=((unique_ptr<tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>,_std::default_delete<tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>_>_>
                 *)in_stack_fffffffffffffd90,
                (unique_ptr<tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>,_std::default_delete<tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>_>_>
                 *)in_stack_fffffffffffffd88);
    std::
    unique_ptr<tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>,_std::default_delete<tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>_>_>
    ::~unique_ptr((unique_ptr<tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>,_std::default_delete<tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>_>_>
                   *)in_stack_fffffffffffffd90);
    operator_new(0x28);
    tstarling::
    ThreadSafeScalableCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>
    ::ThreadSafeScalableCache
              (in_stack_fffffffffffffde0,
               CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
               in_stack_fffffffffffffdd0);
    std::
    unique_ptr<tstarling::ThreadSafeScalableCache<tstarling::ThreadSafeStringKey,int,tstarling::ThreadSafeStringKey::HashCompare>,std::default_delete<tstarling::ThreadSafeScalableCache<tstarling::ThreadSafeStringKey,int,tstarling::ThreadSafeStringKey::HashCompare>>>
    ::
    unique_ptr<std::default_delete<tstarling::ThreadSafeScalableCache<tstarling::ThreadSafeStringKey,int,tstarling::ThreadSafeStringKey::HashCompare>>,void>
              ((unique_ptr<tstarling::ThreadSafeScalableCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>,_std::default_delete<tstarling::ThreadSafeScalableCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>_>_>
                *)in_stack_fffffffffffffd90,(pointer)in_stack_fffffffffffffd88);
    std::
    unique_ptr<tstarling::ThreadSafeScalableCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>,_std::default_delete<tstarling::ThreadSafeScalableCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>_>_>
    ::operator=((unique_ptr<tstarling::ThreadSafeScalableCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>,_std::default_delete<tstarling::ThreadSafeScalableCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>_>_>
                 *)in_stack_fffffffffffffd90,
                (unique_ptr<tstarling::ThreadSafeScalableCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>,_std::default_delete<tstarling::ThreadSafeScalableCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>_>_>
                 *)in_stack_fffffffffffffd88);
    std::
    unique_ptr<tstarling::ThreadSafeScalableCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>,_std::default_delete<tstarling::ThreadSafeScalableCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>_>_>
    ::~unique_ptr((unique_ptr<tstarling::ThreadSafeScalableCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>,_std::default_delete<tstarling::ThreadSafeScalableCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>_>_>
                   *)in_stack_fffffffffffffd90);
    for (local_a4 = 0; local_a4 < (int)local_7c; local_a4 = local_a4 + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e8,100,'x',&local_e9);
      boost::lexical_cast<std::__cxx11::string,int>
                ((int *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      std::operator+(in_stack_fffffffffffffdc8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdc0);
      std::__cxx11::string::~string(local_110);
      std::__cxx11::string::~string(local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
      std::__cxx11::string::data();
      std::__cxx11::string::size();
      tstarling::ThreadSafeStringKey::ThreadSafeStringKey
                ((ThreadSafeStringKey *)
                 CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                 (char *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                 in_stack_fffffffffffffda0);
      std::vector<tstarling::ThreadSafeStringKey,_std::allocator<tstarling::ThreadSafeStringKey>_>::
      push_back((vector<tstarling::ThreadSafeStringKey,_std::allocator<tstarling::ThreadSafeStringKey>_>
                 *)in_stack_fffffffffffffd90,(value_type *)in_stack_fffffffffffffd88);
      tstarling::ThreadSafeStringKey::~ThreadSafeStringKey((ThreadSafeStringKey *)0x11d921);
      std::__cxx11::string::~string(local_c8);
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)0x11da5a);
    std::vector<std::thread,_std::allocator<std::thread>_>::reserve
              ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffffdc0,
               (size_type)in_stack_fffffffffffffdb8);
    local_140 = std::chrono::_V2::steady_clock::now();
    local_148 = 1;
    for (local_14c = 0; local_14c < (int)local_74; local_14c = local_14c + 1) {
      std::thread::thread<void(&)(),,void>
                ((thread *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      std::vector<std::thread,_std::allocator<std::thread>_>::push_back
                (in_stack_fffffffffffffd90,(value_type *)in_stack_fffffffffffffd88);
      std::thread::~thread((thread *)0x11dae6);
    }
    if (local_80 == 0) {
      local_160 = 0;
      local_168 = 0;
      do {
        std::this_thread::sleep_for<long,std::ratio<1l,1l>>
                  ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffdc0);
        local_8 = &globalTotalCount;
        local_c = 5;
        local_10 = std::operator&(memory_order_seq_cst,__memory_order_mask);
        local_18 = globalTotalCount.super___atomic_base<long>._M_i;
        local_170 = globalTotalCount.super___atomic_base<long>._M_i;
        local_20 = &globalHitCount;
        local_24 = 5;
        local_28 = std::operator&(memory_order_seq_cst,__memory_order_mask);
        local_30 = globalHitCount.super___atomic_base<long>._M_i;
        local_178 = globalHitCount.super___atomic_base<long>._M_i;
        printf("rate = %.5g kreq/s, hit ratio = %.3g%%\n",
               (double)(local_170._M_i - local_160) / 1000.0,
               ((double)((long)globalHitCount.super___atomic_base<long>._M_i - local_168) /
               (double)(local_170._M_i - local_160)) * 100.0);
        local_160 = local_170._M_i;
        local_168 = local_178._M_i;
      } while( true );
    }
    local_180 = (rep)std::chrono::operator*
                               ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffd98,
                                (int *)in_stack_fffffffffffffd90);
    std::this_thread::sleep_for<long,std::ratio<1l,1l>>
              ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffdc0);
    local_38 = &globalTotalCount;
    local_3c = 5;
    paVar9 = &globalTotalCount;
    local_40 = std::operator&(memory_order_seq_cst,__memory_order_mask);
    if (local_3c - 1U < 2) {
      local_48 = (paVar9->super___atomic_base<long>)._M_i;
    }
    else if (local_3c == 5) {
      local_48 = (paVar9->super___atomic_base<long>)._M_i;
    }
    else {
      local_48 = (paVar9->super___atomic_base<long>)._M_i;
    }
    local_188 = local_48;
    local_50 = &globalHitCount;
    local_54 = 5;
    paVar9 = &globalHitCount;
    local_58 = std::operator&(memory_order_seq_cst,__memory_order_mask);
    if (local_54 - 1U < 2) {
      local_60 = (paVar9->super___atomic_base<long>)._M_i;
    }
    else if (local_54 == 5) {
      local_60 = (paVar9->super___atomic_base<long>)._M_i;
    }
    else {
      local_60 = (paVar9->super___atomic_base<long>)._M_i;
    }
    local_190 = local_60;
    std::chrono::_V2::steady_clock::now();
    std::chrono::operator-
              (in_stack_fffffffffffffd98,
               (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffd90);
    local_198.__r =
         (rep_conflict)
         std::chrono::
         duration_cast<std::chrono::duration<double,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                   ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffd88);
    stop = true;
    for (local_1ac = 0; local_1ac < (int)local_74; local_1ac = local_1ac + 1) {
      std::vector<std::thread,_std::allocator<std::thread>_>::operator[](&local_138,(long)local_1ac)
      ;
      std::thread::join();
    }
    printf("type\tthreads\tcache\tdemand\tduration\trate\tratio\n");
    this = "scal";
    if (cacheType == LRU) {
      this = "lru";
    }
    uVar6 = local_74;
    uVar7 = local_78;
    uVar8 = local_7c;
    rVar3 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_198);
    dVar4 = (double)local_188 / 1000.0;
    rVar5 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_198);
    printf("%s\t%d\t%d\t%d\t%g\t%g\t%g%%\n",rVar3,dVar4 / rVar5,
           ((double)local_190 / (double)local_188) * 100.0,this,(ulong)uVar6,(ulong)uVar7,
           (ulong)uVar8);
    local_64 = 0;
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)this);
  }
  return local_64;
}

Assistant:

int main(int argc, char ** argv) {
  using std::chrono::steady_clock;
  using std::chrono::seconds;
  using std::chrono::duration_cast;
  using std::chrono::duration;

  if (argc < 5) {
    std::cerr << "Usage: " << argv[0] << " <lru|scalable> <threads> <cache-size> <demand-size> [<duration>]\n";
    return 1;
  }

  if (0 == strcmp(argv[1], "lru")) {
    cacheType = LRU;
  } else if (0 == strcmp(argv[1], "scalable")) {
    cacheType = SCALABLE;
  } else {
    std::cerr << "Cache type must be either \"lru\" or \"scalable\"\n";
    return 1;
  }

  int numThreads = boost::lexical_cast<int>(argv[2]);
  int cacheSize = boost::lexical_cast<int>(argv[3]);
  int demandSize = boost::lexical_cast<int>(argv[4]);
  int durationLimit = 0;

  if (argc > 5) {
    durationLimit = boost::lexical_cast<int>(argv[5]);
  }

  aecm = std::unique_ptr<AtomicCache>(new AtomicCache(cacheSize));
  secm = std::unique_ptr<ScalableCache>(new ScalableCache(cacheSize));
  for (int i = 0; i < demandSize; i++) {
    std::string s = std::string(100, 'x') + boost::lexical_cast<std::string>(i);
    strings.push_back(String(s.data(), s.size()));
  }

  std::vector<std::thread> threads;
  threads.reserve(numThreads);
  auto startTime = steady_clock::now();
  auto oneSecond = seconds(1);

  for (int i = 0; i < numThreads; i++) {
    threads.push_back(std::thread(threadMain));
  }
  if (durationLimit == 0) {
    long prevTotalCount = 0, prevHitCount = 0;
    for (;;) {
      std::this_thread::sleep_for(oneSecond);
      long totalCount = globalTotalCount.load();
      long hitCount = globalHitCount.load();
      printf("rate = %.5g kreq/s, hit ratio = %.3g%%\n",
          (totalCount - prevTotalCount) / 1000.,
          (double)(hitCount - prevHitCount) / (totalCount - prevTotalCount) * 100);

      prevTotalCount = totalCount;
      prevHitCount = hitCount;
    }
  } else {
    std::this_thread::sleep_for(oneSecond * durationLimit);
    long totalCount = globalTotalCount.load();
    long hitCount = globalHitCount.load();
    auto totalTime = duration_cast<duration<double>>(
        steady_clock::now() - startTime);
    stop = true;
    for (int i = 0; i < numThreads; i++) {
      threads[i].join();
    }
    printf("type\tthreads\tcache\tdemand\tduration\trate\tratio\n");
    printf("%s\t%d\t%d\t%d\t%g\t%g\t%g%%\n",
        cacheType == LRU ? "lru" : "scal",
        numThreads,
        cacheSize,
        demandSize,
        totalTime.count(),
        totalCount / 1000. / totalTime.count(),
        (double)hitCount / totalCount * 100);
  }
  return 0;
}